

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb::BitpackingCompressionState<short,_true,_short>::BitpackingWriter::WriteDeltaFor
               (short *values,bool *validity,bitpacking_width_t width,short frame_of_reference,
               short delta_offset,short *original_values,idx_t count,void *data_ptr)

{
  short *psVar1;
  idx_t iVar2;
  undefined7 in_register_00000011;
  ulong uVar3;
  
  uVar3 = CONCAT71(in_register_00000011,width) & 0xffffffff;
  iVar2 = BitpackingPrimitives::GetRequiredSize(count,width);
  ReserveSpace((BitpackingCompressionState<short,_true,_short> *)data_ptr,iVar2 + 6);
  WriteMetaData((BitpackingCompressionState<short,_true,_short> *)data_ptr,DELTA_FOR);
  psVar1 = *(short **)((long)data_ptr + 0x40);
  *psVar1 = frame_of_reference;
  psVar1[1] = (short)uVar3;
  psVar1[2] = delta_offset;
  *(short **)((long)data_ptr + 0x40) = psVar1 + 3;
  BitpackingPrimitives::PackBuffer<short,false>
            ((data_ptr_t)(psVar1 + 3),values,count,(bitpacking_width_t)uVar3);
  *(long *)((long)data_ptr + 0x40) = *(long *)((long)data_ptr + 0x40) + iVar2;
  UpdateStats((BitpackingCompressionState<short,_true,_short> *)data_ptr,count);
  return;
}

Assistant:

static void WriteDeltaFor(T *values, bool *validity, bitpacking_width_t width, T frame_of_reference,
		                          T_S delta_offset, T *original_values, idx_t count, void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			auto bp_size = BitpackingPrimitives::GetRequiredSize(count, width);
			ReserveSpace(state, bp_size + 3 * sizeof(T));

			WriteMetaData(state, BitpackingMode::DELTA_FOR);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, static_cast<T>(width));
			WriteData(state->data_ptr, delta_offset);

			BitpackingPrimitives::PackBuffer<T, false>(state->data_ptr, values, count, width);
			state->data_ptr += bp_size;

			UpdateStats(state, count);
		}